

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O3

void __thiscall
flatbuffers::python::PythonGenerator::GenCompareOperator
          (PythonGenerator *this,StructDef *struct_def,string *code_ptr)

{
  PythonGenerator *this_00;
  long *plVar1;
  pointer ppFVar2;
  long *plVar3;
  size_type *psVar4;
  pointer ppFVar5;
  string field_field;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  string local_130;
  string *local_110;
  PythonGenerator *local_108;
  StructDef *local_100;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  IdlNamer *local_58;
  string local_50;
  
  local_110 = code_ptr;
  local_108 = this;
  local_100 = struct_def;
  GenIndents_abi_cxx11_(&local_130,this,1);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_130);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_140 = *plVar3;
    lStack_138 = plVar1[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *plVar3;
    local_150 = (long *)*plVar1;
  }
  local_148 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_110,(ulong)local_150);
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  GenIndents_abi_cxx11_(&local_130,local_108,2);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_130);
  plVar3 = plVar1 + 2;
  if ((long *)*plVar1 == plVar3) {
    local_140 = *plVar3;
    lStack_138 = plVar1[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *plVar3;
    local_150 = (long *)*plVar1;
  }
  local_148 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::_M_append((char *)local_110,(ulong)local_150);
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  ppFVar5 = (local_100->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppFVar2 = (local_100->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar5 != ppFVar2) {
    local_58 = &local_108->namer_;
    do {
      this_00 = local_108;
      if ((*ppFVar5)->deprecated == false) {
        (*(local_108->namer_).super_Namer._vptr_Namer[0x12])(&local_150,local_58);
        GenIndents_abi_cxx11_(&local_50,this_00,3);
        plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x3715a3);
        local_f8 = &local_e8;
        plVar3 = plVar1 + 2;
        if ((long *)*plVar1 == plVar3) {
          local_e8 = *plVar3;
          lStack_e0 = plVar1[3];
        }
        else {
          local_e8 = *plVar3;
          local_f8 = (long *)*plVar1;
        }
        local_f0 = plVar1[1];
        *plVar1 = (long)plVar3;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        plVar1 = (long *)std::__cxx11::string::append((char *)&local_f8);
        plVar3 = plVar1 + 2;
        if ((long *)*plVar1 == plVar3) {
          local_a8 = *plVar3;
          lStack_a0 = plVar1[3];
          local_b8 = &local_a8;
        }
        else {
          local_a8 = *plVar3;
          local_b8 = (long *)*plVar1;
        }
        local_b0 = plVar1[1];
        *plVar1 = (long)plVar3;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        plVar1 = (long *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_150);
        plVar3 = plVar1 + 2;
        if ((long *)*plVar1 == plVar3) {
          local_88 = *plVar3;
          lStack_80 = plVar1[3];
          local_98 = &local_88;
        }
        else {
          local_88 = *plVar3;
          local_98 = (long *)*plVar1;
        }
        local_90 = plVar1[1];
        *plVar1 = (long)plVar3;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        plVar1 = (long *)std::__cxx11::string::append((char *)&local_98);
        plVar3 = plVar1 + 2;
        if ((long *)*plVar1 == plVar3) {
          local_68 = *plVar3;
          lStack_60 = plVar1[3];
          local_78 = &local_68;
        }
        else {
          local_68 = *plVar3;
          local_78 = (long *)*plVar1;
        }
        local_70 = plVar1[1];
        *plVar1 = (long)plVar3;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        plVar1 = (long *)std::__cxx11::string::append((char *)&local_78);
        local_d8 = &local_c8;
        plVar3 = plVar1 + 2;
        if ((long *)*plVar1 == plVar3) {
          local_c8 = *plVar3;
          lStack_c0 = plVar1[3];
        }
        else {
          local_c8 = *plVar3;
          local_d8 = (long *)*plVar1;
        }
        local_d0 = plVar1[1];
        *plVar1 = (long)plVar3;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        plVar1 = (long *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_150);
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        psVar4 = (size_type *)(plVar1 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar1 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar4) {
          local_130.field_2._M_allocated_capacity = *psVar4;
          local_130.field_2._8_8_ = plVar1[3];
        }
        else {
          local_130.field_2._M_allocated_capacity = *psVar4;
          local_130._M_dataplus._M_p = (pointer)*plVar1;
        }
        local_130._M_string_length = plVar1[1];
        *plVar1 = (long)psVar4;
        plVar1[1] = 0;
        *(undefined1 *)(plVar1 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_110,(ulong)local_130._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        if (local_d8 != &local_c8) {
          operator_delete(local_d8,local_c8 + 1);
        }
        if (local_78 != &local_68) {
          operator_delete(local_78,local_68 + 1);
        }
        if (local_98 != &local_88) {
          operator_delete(local_98,local_88 + 1);
        }
        if (local_b8 != &local_a8) {
          operator_delete(local_b8,local_a8 + 1);
        }
        if (local_f8 != &local_e8) {
          operator_delete(local_f8,local_e8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (local_150 != &local_140) {
          operator_delete(local_150,local_140 + 1);
        }
        ppFVar2 = (local_100->fields).vec.
                  super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      ppFVar5 = ppFVar5 + 1;
    } while (ppFVar5 != ppFVar2);
  }
  std::__cxx11::string::append((char *)local_110);
  return;
}

Assistant:

void GenCompareOperator(const StructDef &struct_def,
                          std::string *code_ptr) const {
    auto &code = *code_ptr;
    code += GenIndents(1) + "def __eq__(self, other):";
    code += GenIndents(2) + "return type(self) == type(other)";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (field.deprecated) continue;

      // Wrties the comparison statement for this field.
      const auto field_field = namer_.Field(field);
      code += " and \\" + GenIndents(3) + "self." + field_field +
              " == " + "other." + field_field;
    }
    code += "\n";
  }